

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::GroupNode> *group,ssize_t id)

{
  pointer pRVar1;
  Node *pNVar2;
  bool bVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  ulong uVar7;
  Ref<embree::SceneGraph::Node> child;
  Ref<embree::SceneGraph::TransformNode> xfmNode;
  map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
  object_to_transform_map;
  key_type local_f0;
  value_type local_e8;
  Ref<embree::SceneGraph::Node> local_e0;
  vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
  local_d8;
  _Rb_tree<embree::Ref<embree::SceneGraph::Node>,_std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>,_std::_Select1st<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
  local_b8;
  string local_88 [32];
  string local_68 [32];
  vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
  local_48;
  
  std::__cxx11::string::string(local_68,"Group",(allocator *)&local_b8);
  open(this,(char *)local_68,(int)id);
  std::__cxx11::string::~string(local_68);
  local_b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8._M_impl.super__Rb_tree_header._M_header;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar7 = 0;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    pRVar1 = (group->ptr->children).
             super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(group->ptr->children).
                      super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 3) <= uVar7) {
      for (p_Var6 = local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &local_b8._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        std::
        vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
        ::vector(&local_48,
                 (vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
                  *)&p_Var6[1]._M_parent);
        store(this,&local_48);
        std::
        vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
        ::~vector(&local_48);
      }
      std::__cxx11::string::string(local_88,"Group",(allocator *)&local_d8);
      close(this,(int)local_88);
      std::__cxx11::string::~string(local_88);
      std::
      _Rb_tree<embree::Ref<embree::SceneGraph::Node>,_std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>,_std::_Select1st<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
      ::~_Rb_tree(&local_b8);
      return;
    }
    pNVar2 = pRVar1[uVar7].ptr;
    if (((pNVar2 == (Node *)0x0) ||
        (local_e8.ptr = (TransformNode *)
                        __dynamic_cast(pNVar2,&SceneGraph::Node::typeinfo,
                                       &SceneGraph::TransformNode::typeinfo,0),
        local_e8.ptr == (TransformNode *)0x0)) ||
       ((*((local_e8.ptr)->super_Node).super_RefCount._vptr_RefCount[2])(local_e8.ptr),
       local_e8.ptr == (TransformNode *)0x0)) {
LAB_0018d73a:
      local_e0.ptr = (group->ptr->children).
                     super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar7].ptr;
      if (local_e0.ptr != (Node *)0x0) {
        (*((local_e0.ptr)->super_RefCount)._vptr_RefCount[2])();
      }
      store(this,&local_e0);
      if (local_e0.ptr != (Node *)0x0) {
        (*((local_e0.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
    }
    else {
      bVar3 = true;
      if ((((local_e8.ptr)->spaces).spaces.size_active == 1) &&
         (((local_e8.ptr)->super_Node).indegree == 1)) {
        local_f0.ptr = ((local_e8.ptr)->child).ptr;
        if (local_f0.ptr != (Node *)0x0) {
          (*((local_f0.ptr)->super_RefCount)._vptr_RefCount[2])();
        }
        iVar4 = std::
                _Rb_tree<embree::Ref<embree::SceneGraph::Node>,_std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>,_std::_Select1st<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
                ::find(&local_b8,&local_f0);
        if ((_Rb_tree_header *)iVar4._M_node == &local_b8._M_impl.super__Rb_tree_header) {
          local_d8.
          super__Vector_base<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_d8.
          super__Vector_base<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_d8.
          super__Vector_base<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pmVar5 = std::
                   map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
                   ::operator[]((map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
                                 *)&local_b8,&local_f0);
          std::
          vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
          ::_M_move_assign(pmVar5,&local_d8);
          std::
          vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
          ::~vector(&local_d8);
        }
        pmVar5 = std::
                 map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
                 ::operator[]((map<embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_std::vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>_>_>_>
                               *)&local_b8,&local_f0);
        std::
        vector<embree::Ref<embree::SceneGraph::TransformNode>,_std::allocator<embree::Ref<embree::SceneGraph::TransformNode>_>_>
        ::push_back(pmVar5,&local_e8);
        if (local_f0.ptr != (Node *)0x0) {
          (*((local_f0.ptr)->super_RefCount)._vptr_RefCount[3])();
        }
        if (local_e8.ptr != (TransformNode *)0x0) {
          bVar3 = false;
          goto LAB_0018d722;
        }
      }
      else {
LAB_0018d722:
        (*((local_e8.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
        if (bVar3) goto LAB_0018d73a;
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::GroupNode> group, ssize_t id)
  {
    open("Group",id);

    std::map<Ref<SceneGraph::Node>,std::vector<Ref<SceneGraph::TransformNode>>> object_to_transform_map;
    for (size_t i=0; i<group->children.size(); i++)
    {
      /* compress transformation of the same object into MultiTransform nodes if possible */
      if (Ref<SceneGraph::TransformNode> xfmNode = group->children[i].dynamicCast<SceneGraph::TransformNode>())
      {
        /* we can only compress non-animated transform nodes and only ones that are referenced once */
        if (xfmNode->spaces.size() == 1 && xfmNode->indegree == 1) 
        {
          Ref<SceneGraph::Node> child = xfmNode->child;
          if (object_to_transform_map.find(child) == object_to_transform_map.end()) {
            object_to_transform_map[child] = std::vector<Ref<SceneGraph::TransformNode>>();
          }
          object_to_transform_map[child].push_back(xfmNode);
          continue;
        }
      }
      store(group->children[i]);
    }
    
    /* store all compressed transform nodes */
    for (auto& i : object_to_transform_map)
      store(i.second);

    close("Group");
  }